

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O1

value_type __thiscall
jsoncons::jsonpath::detail::
keys_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::evaluate
          (keys_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *args,error_code *ec)

{
  char *pcVar1;
  pointer pcVar2;
  bool bVar3;
  void *pvVar4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar5;
  error_code *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  __normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  _Var7;
  value_type vVar8;
  key_type s;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> arg0;
  semantic_tag local_91;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *local_90;
  long *local_88;
  long *local_80 [2];
  long local_70 [2];
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_60;
  object_range_type local_50;
  
  pcVar1 = *(char **)ec;
  if (((long)ec->_M_cat - (long)pcVar1 >> 3) * -0x5555555555555555 -
      (long)(args->
            super__Vector_base<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish == 0) {
    if (*pcVar1 == '\0') {
      pbVar5 = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)(pcVar1 + 8);
    }
    else {
      pbVar5 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)(pcVar1 + 8);
    }
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              (&local_60,pbVar5);
    bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object(&local_60);
    if (bVar3) {
      pvVar4 = operator_new(0x20);
      *(undefined8 *)((long)pvVar4 + 8) = 0;
      *(undefined8 *)((long)pvVar4 + 0x10) = 0;
      *(undefined8 *)((long)pvVar4 + 0x18) = 0;
      *(undefined2 *)
       &(this->
        super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
        )._vptr_function_base = 0xe;
      (this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = (unsigned_long)pvVar4;
      local_90 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)this;
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::reserve
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
                 ((long)ec->_M_cat - *(long *)ec >> 3) * -0x5555555555555555);
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
                (&local_50,
                 (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)&local_60);
      bVar3 = local_50.first_.has_value_ == local_50.last_.has_value_;
      if ((local_50.first_.has_value_ & local_50.last_.has_value_ & 1U) != 0) {
        bVar3 = local_50.first_.it_._M_current == local_50.last_.it_._M_current;
      }
      this = (keys_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)local_90;
      if (!bVar3) {
        _Var7._M_current = local_50.first_.it_._M_current;
        do {
          pcVar2 = ((_Var7._M_current)->key_)._M_dataplus._M_p;
          local_80[0] = local_70;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_80,pcVar2,pcVar2 + ((_Var7._M_current)->key_)._M_string_length)
          ;
          local_88 = local_80[0];
          local_91 = none;
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
          emplace_back<char_const*,jsoncons::semantic_tag>(local_90,(char **)&local_88,&local_91);
          if (local_80[0] != local_70) {
            operator_delete(local_80[0],local_70[0] + 1);
          }
          _Var7._M_current = _Var7._M_current + 1;
          bVar3 = _Var7._M_current == local_50.last_.it_._M_current;
          if ((local_50.first_.has_value_ & local_50.last_.has_value_ & 1U) == 0) {
            bVar3 = local_50.first_.has_value_ == local_50.last_.has_value_;
          }
          this = (keys_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)local_90;
        } while (!bVar3);
      }
    }
    else {
      std::error_code::operator=(in_RCX,invalid_type);
      pbVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,pbVar5);
    }
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(&local_60);
    uVar6 = extraout_RDX_00;
  }
  else {
    std::error_code::operator=(in_RCX,invalid_arity);
    pbVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,pbVar5);
    uVar6 = extraout_RDX;
  }
  vVar8.field_0.int64_.val_ = uVar6;
  vVar8.field_0._0_8_ = this;
  return (value_type)vVar8.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0 = args[0].value();
            if (!arg0.is_object())
            {
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }

            value_type result(json_array_arg, semantic_tag::none, alloc_);
            result.reserve(args.size());

            for (auto& item : arg0.object_range())
            {
                auto s = item.key();
                result.emplace_back(s.c_str(), semantic_tag::none);
            }
            return result;
        }